

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
          (internal *this,null_terminating_iterator<char> it,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *handler)

{
  internal iVar1;
  char *pcVar2;
  format_error *this_00;
  internal iVar3;
  internal *handler_00;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_01;
  internal *piVar4;
  internal *this_02;
  iterator begin;
  iterator begin_00;
  iterator it_00;
  iterator begin_01;
  iterator end;
  iterator end_00;
  iterator end_01;
  null_terminating_iterator<char> nVar5;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_30;
  
  this_01 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             *)it.end_;
  piVar4 = (internal *)it.ptr_;
  this_02 = this;
  if (this != piVar4) {
    handler_00 = this;
    do {
      iVar1 = *handler_00;
      this_02 = handler_00;
      if (iVar1 == (internal)0x0) break;
      this_02 = handler_00 + 1;
      if ((iVar1 == (internal)0x7d) || (iVar1 == (internal)0x7b)) {
        if (this_02 == piVar4) {
          iVar3 = (internal)0x0;
        }
        else {
          iVar3 = *this_02;
        }
        if (iVar3 == iVar1) {
          begin.end_ = (char *)piVar4;
          begin.ptr_ = (char *)this;
          end.end_ = (char *)piVar4;
          end.ptr_ = (char *)this_02;
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(this_01,begin,end);
          this = handler_00 + 2;
          this_02 = this;
        }
        else {
          if (iVar1 == (internal)0x7d) {
            this_00 = (format_error *)__cxa_allocate_exception(0x10);
            format_error::format_error(this_00,"unmatched \'}\' in format string");
            goto LAB_00115132;
          }
          begin_00.end_ = (char *)piVar4;
          begin_00.ptr_ = (char *)this;
          end_00.end_ = (char *)piVar4;
          end_00.ptr_ = (char *)handler_00;
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(this_01,begin_00,end_00);
          nVar5.end_ = (char *)&local_30;
          nVar5.ptr_ = (char *)piVar4;
          local_30 = this_01;
          nVar5 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                            (this_02,nVar5,
                             (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                              *)handler_00);
          it_00.end_ = nVar5.end_;
          pcVar2 = nVar5.ptr_;
          if (pcVar2 == it_00.end_) {
LAB_001150da:
            this_00 = (format_error *)__cxa_allocate_exception(0x10);
            format_error::format_error(this_00,"missing \'}\' in format string");
LAB_00115132:
            __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (*pcVar2 == ':') {
            it_00.ptr_ = pcVar2 + 1;
            nVar5 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                    ::on_format_specs(this_01,it_00);
            if ((nVar5.ptr_ == nVar5.end_) || (*nVar5.ptr_ != '}')) {
              this_00 = (format_error *)__cxa_allocate_exception(0x10);
              format_error::format_error(this_00,"unknown format specifier");
              goto LAB_00115132;
            }
          }
          else {
            if (*pcVar2 != '}') goto LAB_001150da;
            format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            ::on_replacement_field(this_01,nVar5);
          }
          piVar4 = (internal *)nVar5.end_;
          this = (internal *)(nVar5.ptr_ + 1);
          this_02 = this;
        }
      }
      handler_00 = this_02;
    } while (this_02 != piVar4);
  }
  begin_01.end_ = (char *)piVar4;
  begin_01.ptr_ = (char *)this;
  end_01.end_ = (char *)piVar4;
  end_01.ptr_ = (char *)this_02;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::on_text(this_01,begin_01,end_01);
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(Iterator it, Handler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  auto start = it;
  while (*it) {
    char_type ch = *it++;
    if (ch != '{' && ch != '}') continue;
    if (*it == ch) {
      handler.on_text(start, it);
      start = ++it;
      continue;
    }
    if (ch == '}') {
      handler.on_error("unmatched '}' in format string");
      return;
    }
    handler.on_text(start, it - 1);

    it = parse_arg_id(it, id_adapter<Handler, char_type>(handler));
    if (*it == '}') {
      handler.on_replacement_field(it);
    } else if (*it == ':') {
      ++it;
      it = handler.on_format_specs(it);
      if (*it != '}') {
        handler.on_error("unknown format specifier");
        return;
      }
    } else {
      handler.on_error("missing '}' in format string");
      return;
    }

    start = ++it;
  }
  handler.on_text(start, it);
}